

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void deqp::gles3::Functional::anon_unknown_0::verifyUniformValue2i
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,GLint x,
               GLint y)

{
  ostringstream *this;
  bool bVar1;
  StateQueryMemoryWriteGuard<int[2]> state;
  StateQueryMemoryWriteGuard<int[2]> local_1b8;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  local_1b8.m_postguard[0] = -0x21212122;
  local_1b8.m_postguard[1] = -0x21212122;
  local_1b8.m_preguard[0] = -0x21212122;
  local_1b8.m_preguard[1] = -0x21212122;
  local_1b8.m_value[0] = -0x21212122;
  local_1b8.m_value[1] = -0x21212122;
  glu::CallLogWrapper::glGetUniformiv(gl,program,location,local_1b8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
                    (&local_1b8,testCtx);
  if ((bVar1) && ((local_1b8.m_value[0] != 1 || (local_1b8.m_value[1] != x)))) {
    local_198._0_8_ = testCtx->m_log;
    this = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"// ERROR: expected [",0x14);
    std::ostream::operator<<(this,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
    std::ostream::operator<<(this,x);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"]; got [",8);
    std::ostream::operator<<(this,local_1b8.m_value[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
    std::ostream::operator<<(this,local_1b8.m_value[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base(local_120);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  return;
}

Assistant:

void verifyUniformValue2i (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, GLint x, GLint y)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[2]> state;
	gl.glGetUniformiv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x ||
		state[1] != y)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x << ", "
		<< y
		<< "]; got ["
		<< state[0] << ", "
		<< state[1]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}